

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall soul::CompileMessageList::add(CompileMessageList *this,CompileMessageGroup *group)

{
  size_t sVar1;
  ArrayWithPreallocation<soul::CompileMessage,_4UL> *__range1;
  long lVar2;
  CompileMessage *m;
  CompileMessage *__x;
  
  sVar1 = (group->messages).numActive;
  if (sVar1 != 0) {
    __x = (group->messages).items;
    lVar2 = sVar1 * 0x38;
    do {
      std::vector<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>::push_back
                (&this->messages,__x);
      if ((this->onMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->onMessage)._M_invoker)((_Any_data *)this,__x);
      }
      __x = __x + 1;
      lVar2 = lVar2 + -0x38;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

const Item* end() const noexcept                        { return items + numActive; }